

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O3

void __thiscall NaPetriNet::~NaPetriNet(NaPetriNet *this)

{
  this->_vptr_NaPetriNet = (_func_int **)&PTR__NaPetriNet_00176438;
  if ((FILE *)this->fpDig != (FILE *)0x0) {
    fclose((FILE *)this->fpDig);
  }
  if (this->dfTimeChart != (NaDataFile *)0x0) {
    (*this->dfTimeChart->_vptr_NaDataFile[1])();
  }
  if (this->szName != (char *)0x0) {
    operator_delete__(this->szName);
  }
  (this->pnaNet)._vptr_NaDynAr = (_func_int **)&PTR__NaDynAr_001764c8;
  NaDynAr<NaPetriNode_*>::clean(&this->pnaNet);
  NaInfoStand::~NaInfoStand(&this->istand);
  return;
}

Assistant:

NaPetriNet::~NaPetriNet ()
{
    if(NULL != fpDig)
	fclose(fpDig);
    delete dfTimeChart;
    delete[] szName;
}